

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O2

xmlDictEntry *
xmlDictLookupInternal(xmlDictPtr dict,xmlChar *prefix,xmlChar *name,int maybeLen,int update)

{
  _xmlDict *p_Var1;
  undefined4 uVar2;
  uint hashValue;
  uint uVar3;
  int iVar4;
  uint uVar5;
  xmlDictEntry *pxVar6;
  xmlDictEntry *pxVar7;
  ulong uVar8;
  xmlDictStringsPtr_conflict pxVar9;
  ulong uVar10;
  uint uVar11;
  xmlDictEntry *pxVar12;
  xmlDictStringsPtr_conflict *__n;
  int iVar13;
  uint uVar14;
  xmlDictEntry *pxVar15;
  xmlChar *pxVar16;
  ulong uVar17;
  ulong uVar18;
  xmlChar *pxVar19;
  int found;
  xmlDictStringsPtr_conflict *local_50;
  size_t len;
  _xmlDict *local_40;
  size_t plen;
  
  found = 0;
  if (name != (xmlChar *)0x0 && dict != (xmlDictPtr)0x0) {
    if (prefix == (xmlChar *)0x0) {
      iVar4 = -1;
      if (-1 < maybeLen) {
        iVar4 = maybeLen;
      }
      hashValue = xmlDictHashName(dict->seed,name,(long)iVar4,&len);
      uVar8 = CONCAT44(len._4_4_,(uint)len);
      uVar17 = uVar8;
      if (0x3fffffff < uVar8) {
        return (xmlDictEntry *)0x0;
      }
    }
    else {
      hashValue = xmlDictHashQName(dict->seed,prefix,name,&plen,&len);
      uVar8 = CONCAT44(len._4_4_,(uint)len);
      if (0x3fffffff < uVar8) {
        return (xmlDictEntry *)0x0;
      }
      if (0x3fffffff - uVar8 <= plen) {
        return (xmlDictEntry *)0x0;
      }
      uVar17 = plen + uVar8 + 1;
    }
    if (uVar17 <= dict->limit - 1) {
      if (dict->size == 0) {
        uVar3 = 8;
        pxVar6 = (xmlDictEntry *)0x0;
      }
      else {
        pxVar6 = xmlDictFindEntry(dict,prefix,name,(int)uVar17,hashValue,&found);
        if (found != 0) {
          return pxVar6;
        }
        uVar18 = dict->size;
        uVar3 = 0;
        if ((uVar18 >> 3) * 7 < (ulong)(dict->nbElems + 1)) {
          if (0x7fffffff < uVar18) {
            return (xmlDictEntry *)0x0;
          }
          uVar3 = (int)uVar18 * 2;
        }
      }
      p_Var1 = dict->subdict;
      if ((p_Var1 != (_xmlDict *)0x0) && (p_Var1->size != 0)) {
        local_50 = (xmlDictStringsPtr_conflict *)CONCAT44(local_50._4_4_,uVar3);
        local_40 = p_Var1;
        if (prefix == (xmlChar *)0x0) {
          uVar3 = xmlDictHashName(p_Var1->seed,name,uVar8,&len);
        }
        else {
          uVar3 = xmlDictHashQName(p_Var1->seed,prefix,name,&plen,&len);
        }
        pxVar7 = xmlDictFindEntry(local_40,prefix,name,(int)uVar17,uVar3,&found);
        uVar3 = (uint)local_50;
        if (found != 0) {
          return pxVar7;
        }
      }
      if (update != 0) {
        if (uVar3 != 0) {
          uVar8 = (ulong)uVar3;
          pxVar7 = (xmlDictEntry *)(*xmlMalloc)(uVar8 * 0x10);
          if (pxVar7 == (xmlDictEntry *)0x0) {
            return (xmlDictEntry *)0x0;
          }
          memset(pxVar7,0,uVar8 * 0x10);
          uVar17 = dict->size;
          iVar4 = (int)uVar17;
          if (iVar4 != 0) {
            pxVar6 = dict->table;
            pxVar12 = pxVar6;
            while (pxVar12->hashValue != 0) {
              pxVar12 = pxVar12 + 1;
              if (pxVar6 + (uVar17 & 0xffffffff) <= pxVar12) {
                pxVar12 = pxVar6;
              }
            }
            for (iVar13 = 0; iVar13 != iVar4; iVar13 = iVar13 + 1) {
              if (pxVar12->hashValue != 0) {
                pxVar15 = pxVar7 + (pxVar12->hashValue & uVar3 - 1);
                while (pxVar15->hashValue != 0) {
                  pxVar15 = pxVar15 + 1;
                  if (pxVar7 + uVar8 <= pxVar15) {
                    pxVar15 = pxVar7;
                  }
                }
                uVar2 = *(undefined4 *)&pxVar12->field_0x4;
                pxVar19 = pxVar12->name;
                pxVar15->hashValue = pxVar12->hashValue;
                *(undefined4 *)&pxVar15->field_0x4 = uVar2;
                pxVar15->name = pxVar19;
              }
              pxVar12 = pxVar12 + 1;
              if (pxVar6 + (uVar17 & 0xffffffff) <= pxVar12) {
                pxVar12 = dict->table;
              }
            }
            (*xmlFree)(dict->table);
          }
          uVar3 = uVar3 - 1;
          dict->table = pxVar7;
          dict->size = uVar8;
          uVar5 = uVar3 & hashValue;
          uVar11 = 0;
          pxVar6 = pxVar7 + uVar5;
          while ((pxVar6->hashValue != 0 &&
                 (uVar11 <= ((uVar5 + uVar11) - pxVar6->hashValue & uVar3)))) {
            uVar14 = uVar5 + 1 + uVar11;
            uVar11 = uVar11 + 1;
            pxVar6 = pxVar6 + 1;
            if ((uVar14 & uVar3) == 0) {
              pxVar6 = pxVar7;
            }
          }
        }
        if (prefix == (xmlChar *)0x0) {
          uVar18 = (ulong)(uint)len;
          uVar8 = 0;
          uVar17 = 0;
          pxVar9 = (xmlDictStringsPtr_conflict)&dict->strings;
          while (pxVar9 = pxVar9->next, pxVar9 != (xmlDictStringsPtr_conflict)0x0) {
            pxVar16 = pxVar9->free;
            pxVar19 = pxVar16;
            if (uVar18 < (ulong)((long)pxVar9->end - (long)pxVar16)) goto LAB_00128c2f;
            uVar10 = pxVar9->size;
            if (uVar8 < uVar10) {
              uVar8 = uVar10;
            }
            uVar17 = uVar17 + uVar10;
          }
          if ((dict->limit != 0) && (dict->limit < uVar17)) {
            return (xmlDictEntry *)0x0;
          }
          uVar17 = 0xffffffffffffffcf;
          if (uVar8 < 0x3ffffffffffffff3) {
            uVar17 = uVar8 * 4;
          }
          uVar10 = 1000;
          if (uVar8 != 0) {
            uVar10 = uVar17;
          }
          uVar8 = uVar18 * 4;
          if (uVar18 <= uVar10 >> 2) {
            uVar8 = uVar10;
          }
          local_50 = &dict->strings;
          pxVar9 = (xmlDictStringsPtr_conflict)(*xmlMalloc)(uVar8 + 0x30);
          if (pxVar9 == (xmlDictStringsPtr_conflict)0x0) {
            return (xmlDictEntry *)0x0;
          }
          pxVar9->size = uVar8;
          pxVar9->nbStrings = 0;
          pxVar16 = pxVar9->array;
          pxVar9->free = pxVar16;
          pxVar9->end = pxVar9->array + uVar8;
          pxVar9->next = *local_50;
          *local_50 = pxVar9;
          pxVar19 = pxVar16;
        }
        else {
          uVar8 = 0;
          uVar17 = 0;
          pxVar9 = (xmlDictStringsPtr_conflict)&dict->strings;
          while (pxVar9 = pxVar9->next, pxVar9 != (xmlDictStringsPtr_conflict)0x0) {
            pxVar19 = pxVar9->free;
            __n = (xmlDictStringsPtr_conflict *)(plen & 0xffffffff);
            if ((ulong)((uint)len + (int)plen + 1) < (ulong)((long)pxVar9->end - (long)pxVar19))
            goto LAB_00128b51;
            uVar18 = pxVar9->size;
            if (uVar8 < uVar18) {
              uVar8 = uVar18;
            }
            uVar17 = uVar17 + uVar18;
          }
          if ((dict->limit != 0) && (dict->limit < uVar17)) {
            return (xmlDictEntry *)0x0;
          }
          uVar17 = 1000;
          if (uVar8 != 0) {
            uVar17 = uVar8 * 4;
          }
          uVar8 = (ulong)(((uint)len + (int)plen) * 4 + 4);
          if (uVar17 <= uVar8) {
            uVar17 = uVar8;
          }
          local_50 = (xmlDictStringsPtr_conflict *)(plen & 0xffffffff);
          local_40 = (_xmlDict *)&dict->strings;
          pxVar9 = (xmlDictStringsPtr_conflict)(*xmlMalloc)(uVar17 + 0x30);
          if (pxVar9 == (xmlDictStringsPtr_conflict)0x0) {
            return (xmlDictEntry *)0x0;
          }
          pxVar9->size = uVar17;
          pxVar9->nbStrings = 0;
          pxVar19 = pxVar9->array;
          pxVar9->free = pxVar19;
          pxVar9->end = pxVar9->array + uVar17;
          pxVar9->next = *(xmlDictStringsPtr *)local_40;
          *(xmlDictStringsPtr_conflict *)local_40 = pxVar9;
          __n = local_50;
LAB_00128b51:
          memcpy(pxVar19,prefix,(size_t)__n);
          pxVar16 = (xmlChar *)((long)__n + (long)pxVar9->free);
          pxVar9->free = pxVar16 + 1;
          *pxVar16 = ':';
          pxVar16 = pxVar9->free;
        }
LAB_00128c2f:
        memcpy(pxVar16,name,(ulong)(uint)len);
        pxVar16 = pxVar9->free;
        pxVar9->free = pxVar16 + (uint)len + 1;
        pxVar16[(uint)len] = '\0';
        pxVar9->nbStrings = pxVar9->nbStrings + 1;
        if (pxVar19 != (xmlChar *)0x0) {
          if (pxVar6->hashValue != 0) {
            pxVar7 = dict->table;
            pxVar15 = pxVar7 + dict->size;
            pxVar12 = pxVar6;
            do {
              pxVar12 = pxVar12 + 1;
              if (pxVar15 <= pxVar12) {
                pxVar12 = pxVar7;
              }
            } while (pxVar12->hashValue != 0);
            if (pxVar12 < pxVar6) {
              memmove(pxVar7 + 1,pxVar7,(long)pxVar12 - (long)pxVar7);
              pxVar7 = dict->table;
              uVar2 = *(undefined4 *)&pxVar15[-1].field_0x4;
              pxVar16 = pxVar15[-1].name;
              pxVar12 = pxVar15 + -1;
              pxVar7->hashValue = pxVar15[-1].hashValue;
              *(undefined4 *)&pxVar7->field_0x4 = uVar2;
              pxVar7->name = pxVar16;
            }
            memmove(pxVar6 + 1,pxVar6,(long)pxVar12 - (long)pxVar6);
          }
          pxVar6->hashValue = hashValue;
          pxVar6->name = pxVar19;
          dict->nbElems = dict->nbElems + 1;
          return pxVar6;
        }
      }
    }
  }
  return (xmlDictEntry *)0x0;
}

Assistant:

ATTRIBUTE_NO_SANITIZE_INTEGER
static const xmlDictEntry *
xmlDictLookupInternal(xmlDictPtr dict, const xmlChar *prefix,
                      const xmlChar *name, int maybeLen, int update) {
    xmlDictEntry *entry = NULL;
    const xmlChar *ret;
    unsigned hashValue, newSize;
    size_t maxLen, len, plen, klen;
    int found = 0;

    if ((dict == NULL) || (name == NULL))
	return(NULL);

    maxLen = (maybeLen < 0) ? SIZE_MAX : (size_t) maybeLen;

    if (prefix == NULL) {
        hashValue = xmlDictHashName(dict->seed, name, maxLen, &len);
        if (len > INT_MAX / 2)
            return(NULL);
        klen = len;
    } else {
        hashValue = xmlDictHashQName(dict->seed, prefix, name, &plen, &len);
        if ((len > INT_MAX / 2) || (plen >= INT_MAX / 2 - len))
            return(NULL);
        klen = plen + 1 + len;
    }

    if ((dict->limit > 0) && (klen >= dict->limit))
        return(NULL);

    /*
     * Check for an existing entry
     */
    if (dict->size == 0) {
        newSize = MIN_HASH_SIZE;
    } else {
        entry = xmlDictFindEntry(dict, prefix, name, klen, hashValue, &found);
        if (found)
            return(entry);

        if (dict->nbElems + 1 > dict->size / MAX_FILL_DENOM * MAX_FILL_NUM) {
            if (dict->size >= MAX_HASH_SIZE)
                return(NULL);
            newSize = dict->size * 2;
        } else {
            newSize = 0;
        }
    }

    if ((dict->subdict != NULL) && (dict->subdict->size > 0)) {
        xmlDictEntry *subEntry;
        unsigned subHashValue;

        if (prefix == NULL)
            subHashValue = xmlDictHashName(dict->subdict->seed, name, len,
                                           &len);
        else
            subHashValue = xmlDictHashQName(dict->subdict->seed, prefix, name,
                                            &plen, &len);
        subEntry = xmlDictFindEntry(dict->subdict, prefix, name, klen,
                                    subHashValue, &found);
        if (found)
            return(subEntry);
    }

    if (!update)
        return(NULL);

    /*
     * Grow the hash table if needed
     */
    if (newSize > 0) {
        unsigned mask, displ, pos;

        if (xmlDictGrow(dict, newSize) != 0)
            return(NULL);

        /*
         * Find new entry
         */
        mask = dict->size - 1;
        displ = 0;
        pos = hashValue & mask;
        entry = &dict->table[pos];

        while ((entry->hashValue != 0) &&
               ((pos - entry->hashValue) & mask) >= displ) {
            displ++;
            pos++;
            entry++;
            if ((pos & mask) == 0)
                entry = dict->table;
        }
    }

    if (prefix == NULL)
        ret = xmlDictAddString(dict, name, len);
    else
        ret = xmlDictAddQString(dict, prefix, plen, name, len);
    if (ret == NULL)
        return(NULL);

    /*
     * Shift the remainder of the probe sequence to the right
     */
    if (entry->hashValue != 0) {
        const xmlDictEntry *end = &dict->table[dict->size];
        const xmlDictEntry *cur = entry;

        do {
            cur++;
            if (cur >= end)
                cur = dict->table;
        } while (cur->hashValue != 0);

        if (cur < entry) {
            /*
             * If we traversed the end of the buffer, handle the part
             * at the start of the buffer.
             */
            memmove(&dict->table[1], dict->table,
                    (char *) cur - (char *) dict->table);
            cur = end - 1;
            dict->table[0] = *cur;
        }

        memmove(&entry[1], entry, (char *) cur - (char *) entry);
    }

    /*
     * Populate entry
     */
    entry->hashValue = hashValue;
    entry->name = ret;

    dict->nbElems++;

    return(entry);
}